

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O3

void __thiscall CholeskyFactor::solveL(CholeskyFactor *this,QpVector *rhs)

{
  uint uVar1;
  int iVar2;
  pointer pdVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  ulong uVar8;
  double dVar9;
  
  if (this->uptodate == false) {
    recompute(this);
  }
  uVar1 = this->current_k;
  if (uVar1 != rhs->dim) {
    puts("dimension mismatch");
    return;
  }
  if (0 < (int)uVar1) {
    pdVar3 = (rhs->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->current_k_max;
    pdVar4 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    pdVar6 = pdVar4;
    do {
      if (uVar5 == 0) {
        dVar9 = *pdVar3;
      }
      else {
        dVar9 = pdVar3[uVar5];
        uVar8 = 0;
        pdVar7 = pdVar6;
        do {
          dVar9 = dVar9 - pdVar3[uVar8] * *pdVar7;
          pdVar3[uVar5] = dVar9;
          uVar8 = uVar8 + 1;
          pdVar7 = pdVar7 + iVar2;
        } while (uVar5 != uVar8);
      }
      pdVar3[uVar5] = dVar9 / pdVar4[(iVar2 + 1) * (int)uVar5];
      uVar5 = uVar5 + 1;
      pdVar6 = pdVar6 + 1;
    } while (uVar5 != uVar1);
  }
  return;
}

Assistant:

void solveL(QpVector& rhs) {
    if (!uptodate) {
      recompute();
    }

    if (current_k != rhs.dim) {
      printf("dimension mismatch\n");
      return;
    }

    for (HighsInt r = 0; r < rhs.dim; r++) {
      for (HighsInt j = 0; j < r; j++) {
        rhs.value[r] -= rhs.value[j] * L[j * current_k_max + r];
      }

      rhs.value[r] /= L[r * current_k_max + r];
    }
  }